

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ProcessStatsConfig::ProcessStatsConfig(ProcessStatsConfig *this)

{
  ProcessStatsConfig *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ProcessStatsConfig_009c13e8;
  std::
  vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ::vector(&this->quirks_);
  this->scan_all_processes_on_start_ = false;
  this->record_thread_names_ = false;
  this->proc_stats_poll_ms_ = 0;
  this->proc_stats_cache_ttl_ms_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<7UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

ProcessStatsConfig::ProcessStatsConfig() = default;